

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O3

int mg_session_receive_message(mg_session *session)

{
  int iVar1;
  
  mg_linear_allocator_reset((mg_linear_allocator *)session->decoder_allocator);
  session->in_end = 0;
  session->in_cursor = 0;
  do {
    iVar1 = mg_session_read_chunk(session);
  } while (iVar1 == 1);
  return iVar1;
}

Assistant:

int mg_session_receive_message(mg_session *session) {
  // At this point, we reset the session decoder allocator and all objects from
  // the previous message are lost.
  mg_linear_allocator_reset((mg_linear_allocator *)session->decoder_allocator);
  session->in_end = 0;
  session->in_cursor = 0;
  int status;
  do {
    status = mg_session_read_chunk(session);
  } while (status == 1);
  return status;
}